

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void writeParticle(particle *parts,int partcount,int n)

{
  FILE *__stream;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int p;
  FILE *out;
  char fileName [128];
  int local_a4;
  char local_98 [140];
  uint local_c;
  long local_8;
  
  if ((in_RDI != 0) && (in_ESI != 0)) {
    local_c = in_ESI;
    local_8 = in_RDI;
    sprintf(local_98,"ParticleField_%i.vtk",(ulong)in_EDX);
    __stream = fopen(local_98,"w");
    if (__stream != (FILE *)0x0) {
      fprintf(__stream,"# vtk DataFile Version 3.0\n");
      fprintf(__stream,"Partikel\n");
      fprintf(__stream,"ASCII\n");
      fprintf(__stream,"DATASET POLYDATA\n");
      fprintf(__stream,"POINTS %i double\n",(ulong)local_c);
      for (local_a4 = 0; local_a4 < (int)local_c; local_a4 = local_a4 + 1) {
        if ((*(byte *)(local_8 + (long)local_a4 * 0x28 + 0x20) & 1) == 0) {
          fprintf(__stream,"0.1 0.1 -0.1\n");
        }
        else {
          fprintf(__stream,"%e %e 0.0\n",*(undefined8 *)(local_8 + (long)local_a4 * 0x28),
                  *(undefined8 *)(local_8 + (long)local_a4 * 0x28 + 8));
        }
      }
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void writeParticle (particle *parts, int partcount, int n)
{
	if (!parts|| !partcount)
		return;
	char fileName[128];
	sprintf(fileName, "ParticleField_%i.vtk",n);
	FILE *out = fopen(fileName,"w");
	if (out == NULL)
		return;
	fprintf(out,"# vtk DataFile Version 3.0\n");
	fprintf(out,"Partikel\n");
	fprintf(out,"ASCII\n");

	fprintf(out,"DATASET POLYDATA\n");
	fprintf(out,"POINTS %i double\n",partcount);
	for (int p = 0; p < partcount; p++)
	{
		if (!parts[p].onScreen)
			fprintf(out,"0.1 0.1 -0.1\n");
		else
			fprintf(out,"%e %e 0.0\n",parts[p].x,parts[p].y);
	}
	fclose(out);
}